

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O3

void icu_63::CollationKeys::writeSortKeyUpToQuaternary
               (CollationIterator *iter,UBool *compressibleBytes,CollationSettings *settings,
               SortKeyByteSink *sink,Level minLevel,LevelCallback *callback,UBool preflight,
               UErrorCode *errorCode)

{
  char cVar1;
  LevelCallback *pLVar2;
  UBool UVar3;
  byte bVar4;
  byte bVar5;
  int32_t iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uchar *puVar11;
  uchar *puVar12;
  uchar uVar13;
  byte bVar14;
  uint32_t uVar15;
  uint uVar16;
  ulong uVar17;
  uint32_t b;
  int iVar18;
  int iVar19;
  uint32_t uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  bool bVar25;
  char buffer [3];
  SortKeyLevel quaternaries;
  SortKeyLevel secondaries;
  SortKeyLevel tertiaries;
  SortKeyLevel cases;
  int local_190;
  uint local_168;
  int local_164;
  undefined1 local_15f;
  undefined1 local_15e;
  char local_15d;
  uint local_15c;
  int local_158;
  uint local_154;
  CollationSettings *local_150;
  uint local_148;
  uint local_144;
  SortKeyLevel local_140;
  SortKeyLevel local_100;
  LevelCallback *local_c0;
  UBool *local_b8;
  SortKeyLevel local_b0;
  SortKeyLevel local_70;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  uVar24 = settings->options;
  uVar21 = (uVar24 >> 7 & 8 | *(uint *)(levelMasks + (long)((int)uVar24 >> 0xc) * 4)) >>
           ((byte)minLevel & 0x1f);
  bVar14 = (byte)minLevel & 0x1f;
  uVar22 = uVar21 << bVar14;
  if (uVar21 << bVar14 == 0) {
    return;
  }
  local_154 = settings->variableTop + 1;
  if ((uVar24 & 0xc) == 0) {
    local_154 = 0;
  }
  local_148 = uVar24 & 0x600;
  local_144 = 0x3f3f;
  if (local_148 == 0x200) {
    local_144 = 0xff3f;
  }
  local_70.buffer.ptr = local_70.buffer.stackArray;
  local_70.buffer.capacity = 0x28;
  local_70.buffer.needToRelease = '\0';
  local_70.len = 0;
  local_70.ok = 1;
  local_100.buffer.ptr = local_100.buffer.stackArray;
  local_100.buffer.capacity = 0x28;
  local_100.buffer.needToRelease = '\0';
  local_100.len = 0;
  local_100.ok = 1;
  local_b0.buffer.ptr = local_b0.buffer.stackArray;
  local_b0.buffer.capacity = 0x28;
  local_b0.buffer.needToRelease = '\0';
  local_b0.len = 0;
  local_b0.ok = 1;
  local_140.buffer.ptr = local_140.buffer.stackArray;
  local_140.buffer.capacity = 0x28;
  local_140.buffer.needToRelease = '\0';
  local_140.len = 0;
  local_140.ok = 1;
  local_158 = 0;
  local_168 = 0;
  iVar19 = 0;
  local_164 = 0;
  local_190 = 0;
  local_15c = 0;
  local_150 = settings;
  local_c0 = callback;
  local_b8 = compressibleBytes;
  iVar9 = 0;
  do {
    do {
      if (iter->cesIndex == (iter->ceBuffer).length) {
        (iter->ceBuffer).length = 0;
        iter->cesIndex = 0;
      }
      uVar10 = CollationIterator::nextCE(iter,errorCode);
      uVar17 = uVar10 >> 0x20;
      if ((0x2000000ffffffff < uVar10) && ((uint)(uVar10 >> 0x20) < local_154)) {
        if (iVar19 != 0) {
          if (iVar19 < 0x72) {
            iVar19 = iVar19 + -1;
          }
          else {
            iVar18 = iVar19 + 0x70;
            do {
              iVar19 = iVar18;
              anon_unknown_4::SortKeyLevel::appendByte(&local_140,0x8c);
              iVar18 = iVar19 + -0x71;
            } while (0xe1 < iVar18);
            iVar19 = iVar19 + -0xe2;
          }
          anon_unknown_4::SortKeyLevel::appendByte(&local_140,iVar19 + 0x1c);
        }
        do {
          uVar15 = (uint32_t)uVar17;
          if ((uVar22 & 0x20) != 0) {
            if (local_150->reorderTable != (uint8_t *)0x0) {
              bVar14 = local_150->reorderTable[uVar17 >> 0x18];
              if (uVar15 < 2 || bVar14 != 0) {
                uVar15 = uVar15 & 0xffffff | (uint)bVar14 << 0x18;
              }
              else {
                uVar15 = CollationSettings::reorderEx(local_150,uVar15);
              }
            }
            if (0x1affffff < uVar15) {
              anon_unknown_4::SortKeyLevel::appendByte(&local_140,0x1b);
            }
            uVar13 = (uchar)uVar15;
            if ((uVar15 & 0xff0000) == 0) {
              iVar19 = 1;
            }
            else if ((uVar15 & 0xff00) == 0) {
              iVar19 = 2;
            }
            else {
              iVar19 = 4 - (uint)(uVar13 == '\0');
            }
            iVar6 = local_140.len;
            if ((local_140.len + iVar19 <= local_140.buffer.capacity) ||
               (UVar3 = anon_unknown_4::SortKeyLevel::ensureCapacity(&local_140,iVar19),
               iVar6 = local_140.len, UVar3 != '\0')) {
              local_140.buffer.ptr[iVar6] = (uchar)(uVar15 >> 0x18);
              local_140.len = iVar6 + 1;
              if ((uVar15 & 0xff0000) != 0) {
                local_140.buffer.ptr[iVar6 + 1] = (uchar)(uVar15 >> 0x10);
                local_140.len = iVar6 + 2;
                if ((uVar15 & 0xff00) != 0) {
                  local_140.buffer.ptr[iVar6 + 2] = (uchar)(uVar15 >> 8);
                  local_140.len = iVar6 + 3;
                  if (uVar13 != '\0') {
                    local_140.buffer.ptr[iVar6 + 3] = uVar13;
                    local_140.len = iVar6 + 4;
                  }
                }
              }
            }
          }
          do {
            uVar10 = CollationIterator::nextCE(iter,errorCode);
            uVar17 = uVar10 >> 0x20;
          } while (uVar17 == 0);
          iVar19 = 0;
        } while ((0x2000000ffffffff < uVar10) && ((uint)(uVar10 >> 0x20) < local_154));
      }
      uVar15 = (uint32_t)uVar17;
      if (((uVar22 & 2) != 0) && (1 < uVar15)) {
        cVar1 = local_b8[uVar17 >> 0x18];
        if (local_150->reorderTable != (uint8_t *)0x0) {
          bVar14 = local_150->reorderTable[uVar17 >> 0x18];
          if (bVar14 == 0) {
            uVar15 = CollationSettings::reorderEx(local_150,uVar15);
            uVar17 = (ulong)uVar15;
          }
          else {
            uVar17 = (ulong)(uVar15 & 0xffffff | (uint)bVar14 << 0x18);
          }
        }
        uVar15 = (uint32_t)uVar17;
        uVar20 = (uint32_t)(uVar17 >> 0x18);
        if ((cVar1 == '\0') || (uVar20 != local_15c >> 0x18)) {
          if ((local_15c != 0) && ((b = 0xff, local_15c <= uVar15 || (b = 3, 0x2ffffff < uVar15))))
          {
            SortKeyByteSink::Append(sink,b);
          }
          SortKeyByteSink::Append(sink,uVar20);
          local_15c = 0;
          if (cVar1 != '\0') {
            local_15c = uVar15;
          }
        }
        if ((uVar17 & 0xff0000) != 0) {
          local_15f = (undefined1)(uVar17 >> 0x10);
          local_15e = (undefined1)(uVar17 >> 8);
          local_15d = (char)uVar17;
          uVar21 = 3 - (local_15d == '\0');
          if ((uVar17 & 0xff00) == 0) {
            uVar21 = 1;
          }
          (*(sink->super_ByteSink)._vptr_ByteSink[2])(sink,&local_15f,(ulong)uVar21);
        }
        if ((preflight == '\0') && (sink->capacity_ < sink->appended_)) {
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0025bc42;
          goto LAB_0025bc55;
        }
      }
      uVar21 = (uint)uVar10;
    } while (uVar21 == 0);
    iVar18 = iVar9;
    if (((uVar22 & 4) != 0) && (0xffff < uVar21)) {
      uVar16 = (uint)(uVar10 >> 0x10);
      uVar8 = uVar16 & 0xffff;
      if (((uVar16 & 0xffff) == 0x500) && ((uVar24 >> 0xb & 1) == 0 || uVar15 != 0x2000000)) {
        iVar18 = iVar9 + 1;
      }
      else if ((uVar24 >> 0xb & 1) == 0) {
        if (iVar9 != 0) {
          if (iVar9 < 0x22) {
            iVar9 = iVar9 + -1;
          }
          else {
            iVar18 = iVar9 + 0x20;
            do {
              iVar9 = iVar18;
              anon_unknown_4::SortKeyLevel::appendByte(&local_100,0x25);
              iVar18 = iVar9 + -0x21;
            } while (0x41 < iVar18);
            iVar9 = iVar9 + -0x42;
          }
          uVar20 = iVar9 + 5;
          if (0x4ffffff < uVar21) {
            uVar20 = 0x45 - iVar9;
          }
          anon_unknown_4::SortKeyLevel::appendByte(&local_100,uVar20);
        }
        iVar18 = 0;
        anon_unknown_4::SortKeyLevel::appendWeight16(&local_100,uVar8);
      }
      else {
        if (iVar9 == 0) {
          iVar18 = 0;
        }
        else {
          iVar7 = iVar9 + -1;
          iVar23 = iVar7 % 0x21;
          uVar20 = 0x45 - iVar23;
          if (local_168 < 0x500) {
            uVar20 = iVar23 + 5;
          }
          anon_unknown_4::SortKeyLevel::appendByte(&local_100,uVar20);
          iVar18 = iVar7 - iVar23;
          if (iVar18 != 0 && iVar23 <= iVar7) {
            iVar9 = (iVar9 - iVar23) + 0x20;
            do {
              iVar18 = iVar9;
              anon_unknown_4::SortKeyLevel::appendByte(&local_100,0x25);
              iVar9 = iVar18 + -0x21;
            } while (0x21 < iVar9);
            iVar18 = iVar18 + -0x42;
          }
        }
        if (uVar15 - 1 < 0x2000000) {
          if (local_158 < local_100.len + -1) {
            puVar11 = local_100.buffer.ptr + local_158;
            puVar12 = local_100.buffer.ptr + (long)local_100.len + -2;
            do {
              uVar13 = *puVar11;
              *puVar11 = puVar12[1];
              puVar11 = puVar11 + 1;
              puVar12[1] = uVar13;
              bVar25 = puVar11 < puVar12;
              puVar12 = puVar12 + -1;
            } while (bVar25);
          }
          anon_unknown_4::SortKeyLevel::appendByte(&local_100,(uVar15 != 1) + 1);
          local_168 = 0;
          local_158 = local_100.len;
        }
        else {
          iVar9 = 2 - (uint)((uVar10 & 0xff0000) == 0);
          local_168 = uVar8;
          if ((local_100.len + iVar9 <= local_100.buffer.capacity) ||
             (UVar3 = anon_unknown_4::SortKeyLevel::ensureCapacity(&local_100,iVar9), UVar3 != '\0')
             ) {
            uVar13 = (uchar)(uVar10 >> 0x18);
            if ((uVar10 & 0xff0000) == 0) {
              local_100.buffer.ptr[local_100.len] = uVar13;
              local_100.len = local_100.len + 1;
            }
            else {
              local_100.buffer.ptr[local_100.len] = (uchar)uVar8;
              local_100.buffer.ptr[(long)local_100.len + 1] = uVar13;
              local_100.len = local_100.len + 2;
            }
          }
        }
      }
    }
    if ((uVar22 & 8) != 0) {
      if (uVar24 < 0x1000) {
        if (uVar15 != 0) {
LAB_0025b7f9:
          bVar14 = (byte)(uVar10 >> 8);
          uVar15 = (uint32_t)bVar14;
          if (bVar14 < 2 || (uVar10 & 0xc000) != 0) {
            if ((uVar24 >> 8 & 1) == 0) {
              if (local_190 != 0) {
                if ((bVar14 < 2) && (local_70.len == 0)) goto LAB_0025b931;
                if (local_190 < 8) {
                  local_190 = local_190 + -1;
                }
                else {
                  iVar9 = local_190 + 6;
                  do {
                    local_190 = iVar9;
                    anon_unknown_4::SortKeyLevel::appendByte(&local_70,0x70);
                    iVar9 = local_190 + -7;
                  } while (0xd < iVar9);
                  local_190 = local_190 + -0xe;
                }
                iVar9 = local_190 + 1;
                if (1 < bVar14) {
                  iVar9 = 0xd - local_190;
                }
                anon_unknown_4::SortKeyLevel::appendByte(&local_70,iVar9 << 4);
              }
              uVar15 = (uint32_t)bVar14;
              local_190 = 0;
              if (1 < uVar15) {
                uVar15 = ((uint)(uVar10 >> 10) & 0x30) + 0xd0;
              }
            }
            else {
              if (local_190 != 0) {
                if (local_190 < 0xe) {
                  local_190 = local_190 + -1;
                }
                else {
                  iVar9 = local_190 + 0xc;
                  do {
                    local_190 = iVar9;
                    anon_unknown_4::SortKeyLevel::appendByte(&local_70,0x30);
                    iVar9 = local_190 + -0xd;
                  } while (0x19 < iVar9);
                  local_190 = local_190 + -0x1a;
                }
                anon_unknown_4::SortKeyLevel::appendByte(&local_70,local_190 * 0x10 + 0x30);
              }
              uVar15 = (uint32_t)bVar14;
              local_190 = 0;
              if (1 < uVar15) {
                uVar15 = ~uVar21 >> 10 & 0x30;
              }
            }
LAB_0025b931:
            anon_unknown_4::SortKeyLevel::appendByte(&local_70,uVar15);
          }
          else {
            local_190 = local_190 + 1;
          }
        }
      }
      else if (0xffff < uVar21) goto LAB_0025b7f9;
    }
    if ((uVar22 & 0x10) != 0) {
      uVar16 = local_144 & uVar21;
      if (uVar16 == 0x500) {
        local_164 = local_164 + 1;
      }
      else {
        if (local_148 == 0x200) {
          if ((uVar24 >> 8 & 1) == 0) {
            if (local_164 != 0) {
              if (local_164 < 0x22) {
                local_164 = local_164 + -1;
              }
              else {
                iVar9 = local_164 + 0x20;
                do {
                  local_164 = iVar9;
                  anon_unknown_4::SortKeyLevel::appendByte(&local_b0,0x25);
                  iVar9 = local_164 + -0x21;
                } while (0x41 < iVar9);
                local_164 = local_164 + -0x42;
              }
              uVar15 = local_164 + 5;
              if (0x4ff < uVar16) {
                uVar15 = 0x45 - local_164;
              }
              anon_unknown_4::SortKeyLevel::appendByte(&local_b0,uVar15);
            }
            uVar8 = uVar16 + 0x4000;
            goto LAB_0025ba97;
          }
          if (0x100 < uVar16) {
            if (uVar21 < 0x10000) {
              uVar16 = uVar16 + 0x4000;
            }
            else {
              uVar8 = uVar16 ^ 0xc000;
              uVar16 = uVar8 - 0x4000;
              if (0xc4ff < uVar8) {
                uVar16 = uVar8;
              }
            }
          }
          uVar8 = uVar16;
          if (local_164 != 0) {
            if (local_164 < 0x22) {
              local_164 = local_164 + -1;
            }
            else {
              iVar9 = local_164 + 0x20;
              do {
                local_164 = iVar9;
                anon_unknown_4::SortKeyLevel::appendByte(&local_b0,0xa5);
                iVar9 = local_164 + -0x21;
              } while (0x41 < iVar9);
              local_164 = local_164 + -0x42;
            }
            uVar15 = local_164 + 0x85;
            if (0x84ff < uVar16) {
              uVar15 = 0xc5 - local_164;
            }
            anon_unknown_4::SortKeyLevel::appendByte(&local_b0,uVar15);
          }
        }
        else {
          if (local_164 != 0) {
            if (local_164 < 0x62) {
              local_164 = local_164 + -1;
            }
            else {
              iVar9 = local_164 + 0x60;
              do {
                local_164 = iVar9;
                anon_unknown_4::SortKeyLevel::appendByte(&local_b0,0x65);
                iVar9 = local_164 + -0x61;
              } while (0xc1 < iVar9);
              local_164 = local_164 + -0xc2;
            }
            uVar15 = local_164 + 5;
            if (0x4ff < uVar16) {
              uVar15 = 0xc5 - local_164;
            }
            anon_unknown_4::SortKeyLevel::appendByte(&local_b0,uVar15);
          }
          uVar8 = uVar16 + 0xc000;
LAB_0025ba97:
          if (uVar16 < 0x501) {
            uVar8 = uVar16;
          }
        }
        local_164 = 0;
        anon_unknown_4::SortKeyLevel::appendWeight16(&local_b0,uVar8);
      }
    }
    if ((uVar22 & 0x20) != 0) {
      uVar16 = uVar21 & 0xffff;
      if (uVar16 < 0x101 || (uVar10 & 0xc0) != 0) {
        if ((((uVar24 & 0xc) == 0) && (uVar16 == 0x100)) && (local_140.len == 0)) {
          anon_unknown_4::SortKeyLevel::appendByte(&local_140,1);
        }
        else {
          uVar15 = (uint)(uVar10 >> 6) & 0xff | 0xfc;
          if (uVar16 == 0x100) {
            uVar15 = 1;
          }
          if (iVar19 != 0) {
            if (iVar19 < 0x72) {
              iVar19 = iVar19 + -1;
            }
            else {
              iVar9 = iVar19 + 0x70;
              do {
                iVar19 = iVar9;
                anon_unknown_4::SortKeyLevel::appendByte(&local_140,0x8c);
                iVar9 = iVar19 + -0x71;
              } while (0xe1 < iVar9);
              iVar19 = iVar19 + -0xe2;
            }
            uVar20 = iVar19 + 0x1c;
            if (uVar16 != 0x100) {
              uVar20 = 0xfc - iVar19;
            }
            anon_unknown_4::SortKeyLevel::appendByte(&local_140,uVar20);
          }
          iVar19 = 0;
          anon_unknown_4::SortKeyLevel::appendByte(&local_140,uVar15);
        }
      }
      else {
        iVar19 = iVar19 + 1;
      }
    }
    pLVar2 = local_c0;
    iVar9 = iVar18;
  } while ((uVar21 & 0xff000000) != 0x1000000);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar14 = 1;
    if ((uVar22 & 4) != 0) {
      iVar9 = (*local_c0->_vptr_LevelCallback[2])(local_c0,2);
      UVar3 = local_100.ok;
      if ((char)iVar9 == '\0') goto LAB_0025bc55;
      SortKeyByteSink::Append(sink,1);
      (*(sink->super_ByteSink)._vptr_ByteSink[2])
                (sink,local_100.buffer.ptr,(ulong)(local_100.len - 1));
      bVar14 = UVar3 & 1;
    }
    if ((uVar22 & 8) != 0) {
      iVar9 = (*pLVar2->_vptr_LevelCallback[2])(pLVar2,3);
      if ((char)iVar9 == '\0') goto LAB_0025bc55;
      bVar14 = bVar14 & local_70.ok;
      SortKeyByteSink::Append(sink,1);
      if (1 < local_70.len) {
        uVar24 = local_70.len - 1;
        uVar10 = 0;
        bVar4 = 0;
        do {
          bVar5 = local_70.buffer.ptr[uVar10];
          if (bVar4 != 0) {
            SortKeyByteSink::Append(sink,(uint)(byte)(bVar5 >> 4 | bVar4));
            bVar5 = 0;
          }
          uVar10 = uVar10 + 1;
          bVar4 = bVar5;
        } while (uVar24 != uVar10);
        if (bVar5 != 0) {
          SortKeyByteSink::Append(sink,(uint)bVar5);
        }
      }
    }
    if ((uVar22 & 0x10) != 0) {
      iVar9 = (*pLVar2->_vptr_LevelCallback[2])(pLVar2,4);
      UVar3 = local_b0.ok;
      if ((char)iVar9 == '\0') goto LAB_0025bc55;
      SortKeyByteSink::Append(sink,1);
      (*(sink->super_ByteSink)._vptr_ByteSink[2])
                (sink,local_b0.buffer.ptr,(ulong)(local_b0.len - 1));
      bVar14 = bVar14 & UVar3;
    }
    if ((uVar22 & 0x20) != 0) {
      iVar9 = (*pLVar2->_vptr_LevelCallback[2])(pLVar2,5);
      UVar3 = local_140.ok;
      if ((char)iVar9 == '\0') goto LAB_0025bc55;
      SortKeyByteSink::Append(sink,1);
      (*(sink->super_ByteSink)._vptr_ByteSink[2])
                (sink,local_140.buffer.ptr,(ulong)(local_140.len - 1));
      bVar14 = bVar14 & UVar3;
    }
    if (bVar14 != 0) {
LAB_0025bc42:
      if (sink->buffer_ != (char *)0x0) goto LAB_0025bc55;
    }
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
LAB_0025bc55:
  MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&local_140.buffer);
  MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&local_b0.buffer);
  MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&local_100.buffer);
  MaybeStackArray<unsigned_char,_40>::~MaybeStackArray(&local_70.buffer);
  return;
}

Assistant:

void
CollationKeys::writeSortKeyUpToQuaternary(CollationIterator &iter,
                                          const UBool *compressibleBytes,
                                          const CollationSettings &settings,
                                          SortKeyByteSink &sink,
                                          Collation::Level minLevel, LevelCallback &callback,
                                          UBool preflight, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }

    int32_t options = settings.options;
    // Set of levels to process and write.
    uint32_t levels = levelMasks[CollationSettings::getStrength(options)];
    if((options & CollationSettings::CASE_LEVEL) != 0) {
        levels |= Collation::CASE_LEVEL_FLAG;
    }
    // Minus the levels below minLevel.
    levels &= ~(((uint32_t)1 << minLevel) - 1);
    if(levels == 0) { return; }

    uint32_t variableTop;
    if((options & CollationSettings::ALTERNATE_MASK) == 0) {
        variableTop = 0;
    } else {
        // +1 so that we can use "<" and primary ignorables test out early.
        variableTop = settings.variableTop + 1;
    }

    uint32_t tertiaryMask = CollationSettings::getTertiaryMask(options);

    SortKeyLevel cases;
    SortKeyLevel secondaries;
    SortKeyLevel tertiaries;
    SortKeyLevel quaternaries;

    uint32_t prevReorderedPrimary = 0;  // 0==no compression
    int32_t commonCases = 0;
    int32_t commonSecondaries = 0;
    int32_t commonTertiaries = 0;
    int32_t commonQuaternaries = 0;

    uint32_t prevSecondary = 0;
    int32_t secSegmentStart = 0;

    for(;;) {
        // No need to keep all CEs in the buffer when we write a sort key.
        iter.clearCEsIfNoneRemaining();
        int64_t ce = iter.nextCE(errorCode);
        uint32_t p = (uint32_t)(ce >> 32);
        if(p < variableTop && p > Collation::MERGE_SEPARATOR_PRIMARY) {
            // Variable CE, shift it to quaternary level.
            // Ignore all following primary ignorables, and shift further variable CEs.
            if(commonQuaternaries != 0) {
                --commonQuaternaries;
                while(commonQuaternaries >= QUAT_COMMON_MAX_COUNT) {
                    quaternaries.appendByte(QUAT_COMMON_MIDDLE);
                    commonQuaternaries -= QUAT_COMMON_MAX_COUNT;
                }
                // Shifted primary weights are lower than the common weight.
                quaternaries.appendByte(QUAT_COMMON_LOW + commonQuaternaries);
                commonQuaternaries = 0;
            }
            do {
                if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
                    if(settings.hasReordering()) {
                        p = settings.reorder(p);
                    }
                    if((p >> 24) >= QUAT_SHIFTED_LIMIT_BYTE) {
                        // Prevent shifted primary lead bytes from
                        // overlapping with the common compression range.
                        quaternaries.appendByte(QUAT_SHIFTED_LIMIT_BYTE);
                    }
                    quaternaries.appendWeight32(p);
                }
                do {
                    ce = iter.nextCE(errorCode);
                    p = (uint32_t)(ce >> 32);
                } while(p == 0);
            } while(p < variableTop && p > Collation::MERGE_SEPARATOR_PRIMARY);
        }
        // ce could be primary ignorable, or NO_CE, or the merge separator,
        // or a regular primary CE, but it is not variable.
        // If ce==NO_CE, then write nothing for the primary level but
        // terminate compression on all levels and then exit the loop.
        if(p > Collation::NO_CE_PRIMARY && (levels & Collation::PRIMARY_LEVEL_FLAG) != 0) {
            // Test the un-reordered primary for compressibility.
            UBool isCompressible = compressibleBytes[p >> 24];
            if(settings.hasReordering()) {
                p = settings.reorder(p);
            }
            uint32_t p1 = p >> 24;
            if(!isCompressible || p1 != (prevReorderedPrimary >> 24)) {
                if(prevReorderedPrimary != 0) {
                    if(p < prevReorderedPrimary) {
                        // No primary compression terminator
                        // at the end of the level or merged segment.
                        if(p1 > Collation::MERGE_SEPARATOR_BYTE) {
                            sink.Append(Collation::PRIMARY_COMPRESSION_LOW_BYTE);
                        }
                    } else {
                        sink.Append(Collation::PRIMARY_COMPRESSION_HIGH_BYTE);
                    }
                }
                sink.Append(p1);
                if(isCompressible) {
                    prevReorderedPrimary = p;
                } else {
                    prevReorderedPrimary = 0;
                }
            }
            char p2 = (char)(p >> 16);
            if(p2 != 0) {
                char buffer[3] = { p2, (char)(p >> 8), (char)p };
                sink.Append(buffer, (buffer[1] == 0) ? 1 : (buffer[2] == 0) ? 2 : 3);
            }
            // Optimization for internalNextSortKeyPart():
            // When the primary level overflows we can stop because we need not
            // calculate (preflight) the whole sort key length.
            if(!preflight && sink.Overflowed()) {
                if(U_SUCCESS(errorCode) && !sink.IsOk()) {
                    errorCode = U_MEMORY_ALLOCATION_ERROR;
                }
                return;
            }
        }

        uint32_t lower32 = (uint32_t)ce;
        if(lower32 == 0) { continue; }  // completely ignorable, no secondary/case/tertiary/quaternary

        if((levels & Collation::SECONDARY_LEVEL_FLAG) != 0) {
            uint32_t s = lower32 >> 16;
            if(s == 0) {
                // secondary ignorable
            } else if(s == Collation::COMMON_WEIGHT16 &&
                    ((options & CollationSettings::BACKWARD_SECONDARY) == 0 ||
                        p != Collation::MERGE_SEPARATOR_PRIMARY)) {
                // s is a common secondary weight, and
                // backwards-secondary is off or the ce is not the merge separator.
                ++commonSecondaries;
            } else if((options & CollationSettings::BACKWARD_SECONDARY) == 0) {
                if(commonSecondaries != 0) {
                    --commonSecondaries;
                    while(commonSecondaries >= SEC_COMMON_MAX_COUNT) {
                        secondaries.appendByte(SEC_COMMON_MIDDLE);
                        commonSecondaries -= SEC_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(s < Collation::COMMON_WEIGHT16) {
                        b = SEC_COMMON_LOW + commonSecondaries;
                    } else {
                        b = SEC_COMMON_HIGH - commonSecondaries;
                    }
                    secondaries.appendByte(b);
                    commonSecondaries = 0;
                }
                secondaries.appendWeight16(s);
            } else {
                if(commonSecondaries != 0) {
                    --commonSecondaries;
                    // Append reverse weights. The level will be re-reversed later.
                    int32_t remainder = commonSecondaries % SEC_COMMON_MAX_COUNT;
                    uint32_t b;
                    if(prevSecondary < Collation::COMMON_WEIGHT16) {
                        b = SEC_COMMON_LOW + remainder;
                    } else {
                        b = SEC_COMMON_HIGH - remainder;
                    }
                    secondaries.appendByte(b);
                    commonSecondaries -= remainder;
                    // commonSecondaries is now a multiple of SEC_COMMON_MAX_COUNT.
                    while(commonSecondaries > 0) {  // same as >= SEC_COMMON_MAX_COUNT
                        secondaries.appendByte(SEC_COMMON_MIDDLE);
                        commonSecondaries -= SEC_COMMON_MAX_COUNT;
                    }
                    // commonSecondaries == 0
                }
                if(0 < p && p <= Collation::MERGE_SEPARATOR_PRIMARY) {
                    // The backwards secondary level compares secondary weights backwards
                    // within segments separated by the merge separator (U+FFFE).
                    uint8_t *secs = secondaries.data();
                    int32_t last = secondaries.length() - 1;
                    if(secSegmentStart < last) {
                        uint8_t *q = secs + secSegmentStart;
                        uint8_t *r = secs + last;
                        do {
                            uint8_t b = *q;
                            *q++ = *r;
                            *r-- = b;
                        } while(q < r);
                    }
                    secondaries.appendByte(p == Collation::NO_CE_PRIMARY ?
                        Collation::LEVEL_SEPARATOR_BYTE : Collation::MERGE_SEPARATOR_BYTE);
                    prevSecondary = 0;
                    secSegmentStart = secondaries.length();
                } else {
                    secondaries.appendReverseWeight16(s);
                    prevSecondary = s;
                }
            }
        }

        if((levels & Collation::CASE_LEVEL_FLAG) != 0) {
            if((CollationSettings::getStrength(options) == UCOL_PRIMARY) ?
                    p == 0 : lower32 <= 0xffff) {
                // Primary+caseLevel: Ignore case level weights of primary ignorables.
                // Otherwise: Ignore case level weights of secondary ignorables.
                // For details see the comments in the CollationCompare class.
            } else {
                uint32_t c = (lower32 >> 8) & 0xff;  // case bits & tertiary lead byte
                U_ASSERT((c & 0xc0) != 0xc0);
                if((c & 0xc0) == 0 && c > Collation::LEVEL_SEPARATOR_BYTE) {
                    ++commonCases;
                } else {
                    if((options & CollationSettings::UPPER_FIRST) == 0) {
                        // lowerFirst: Compress common weights to nibbles 1..7..13, mixed=14, upper=15.
                        // If there are only common (=lowest) weights in the whole level,
                        // then we need not write anything.
                        // Level length differences are handled already on the next-higher level.
                        if(commonCases != 0 &&
                                (c > Collation::LEVEL_SEPARATOR_BYTE || !cases.isEmpty())) {
                            --commonCases;
                            while(commonCases >= CASE_LOWER_FIRST_COMMON_MAX_COUNT) {
                                cases.appendByte(CASE_LOWER_FIRST_COMMON_MIDDLE << 4);
                                commonCases -= CASE_LOWER_FIRST_COMMON_MAX_COUNT;
                            }
                            uint32_t b;
                            if(c <= Collation::LEVEL_SEPARATOR_BYTE) {
                                b = CASE_LOWER_FIRST_COMMON_LOW + commonCases;
                            } else {
                                b = CASE_LOWER_FIRST_COMMON_HIGH - commonCases;
                            }
                            cases.appendByte(b << 4);
                            commonCases = 0;
                        }
                        if(c > Collation::LEVEL_SEPARATOR_BYTE) {
                            c = (CASE_LOWER_FIRST_COMMON_HIGH + (c >> 6)) << 4;  // 14 or 15
                        }
                    } else {
                        // upperFirst: Compress common weights to nibbles 3..15, mixed=2, upper=1.
                        // The compressed common case weights only go up from the "low" value
                        // because with upperFirst the common weight is the highest one.
                        if(commonCases != 0) {
                            --commonCases;
                            while(commonCases >= CASE_UPPER_FIRST_COMMON_MAX_COUNT) {
                                cases.appendByte(CASE_UPPER_FIRST_COMMON_LOW << 4);
                                commonCases -= CASE_UPPER_FIRST_COMMON_MAX_COUNT;
                            }
                            cases.appendByte((CASE_UPPER_FIRST_COMMON_LOW + commonCases) << 4);
                            commonCases = 0;
                        }
                        if(c > Collation::LEVEL_SEPARATOR_BYTE) {
                            c = (CASE_UPPER_FIRST_COMMON_LOW - (c >> 6)) << 4;  // 2 or 1
                        }
                    }
                    // c is a separator byte 01,
                    // or a left-shifted nibble 0x10, 0x20, ... 0xf0.
                    cases.appendByte(c);
                }
            }
        }

        if((levels & Collation::TERTIARY_LEVEL_FLAG) != 0) {
            uint32_t t = lower32 & tertiaryMask;
            U_ASSERT((lower32 & 0xc000) != 0xc000);
            if(t == Collation::COMMON_WEIGHT16) {
                ++commonTertiaries;
            } else if((tertiaryMask & 0x8000) == 0) {
                // Tertiary weights without case bits.
                // Move lead bytes 06..3F to C6..FF for a large common-weight range.
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_ONLY_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_ONLY_COMMON_MIDDLE);
                        commonTertiaries -= TER_ONLY_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < Collation::COMMON_WEIGHT16) {
                        b = TER_ONLY_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_ONLY_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                if(t > Collation::COMMON_WEIGHT16) { t += 0xc000; }
                tertiaries.appendWeight16(t);
            } else if((options & CollationSettings::UPPER_FIRST) == 0) {
                // Tertiary weights with caseFirst=lowerFirst.
                // Move lead bytes 06..BF to 46..FF for the common-weight range.
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_LOWER_FIRST_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_LOWER_FIRST_COMMON_MIDDLE);
                        commonTertiaries -= TER_LOWER_FIRST_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < Collation::COMMON_WEIGHT16) {
                        b = TER_LOWER_FIRST_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_LOWER_FIRST_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                if(t > Collation::COMMON_WEIGHT16) { t += 0x4000; }
                tertiaries.appendWeight16(t);
            } else {
                // Tertiary weights with caseFirst=upperFirst.
                // Do not change the artificial uppercase weight of a tertiary CE (0.0.ut),
                // to keep tertiary CEs well-formed.
                // Their case+tertiary weights must be greater than those of
                // primary and secondary CEs.
                //
                // Separator         01 -> 01      (unchanged)
                // Lowercase     02..04 -> 82..84  (includes uncased)
                // Common weight     05 -> 85..C5  (common-weight compression range)
                // Lowercase     06..3F -> C6..FF
                // Mixed case    42..7F -> 42..7F
                // Uppercase     82..BF -> 02..3F
                // Tertiary CE   86..BF -> C6..FF
                if(t <= Collation::NO_CE_WEIGHT16) {
                    // Keep separators unchanged.
                } else if(lower32 > 0xffff) {
                    // Invert case bits of primary & secondary CEs.
                    t ^= 0xc000;
                    if(t < (TER_UPPER_FIRST_COMMON_HIGH << 8)) {
                        t -= 0x4000;
                    }
                } else {
                    // Keep uppercase bits of tertiary CEs.
                    U_ASSERT(0x8600 <= t && t <= 0xbfff);
                    t += 0x4000;
                }
                if(commonTertiaries != 0) {
                    --commonTertiaries;
                    while(commonTertiaries >= TER_UPPER_FIRST_COMMON_MAX_COUNT) {
                        tertiaries.appendByte(TER_UPPER_FIRST_COMMON_MIDDLE);
                        commonTertiaries -= TER_UPPER_FIRST_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(t < (TER_UPPER_FIRST_COMMON_LOW << 8)) {
                        b = TER_UPPER_FIRST_COMMON_LOW + commonTertiaries;
                    } else {
                        b = TER_UPPER_FIRST_COMMON_HIGH - commonTertiaries;
                    }
                    tertiaries.appendByte(b);
                    commonTertiaries = 0;
                }
                tertiaries.appendWeight16(t);
            }
        }

        if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
            uint32_t q = lower32 & 0xffff;
            if((q & 0xc0) == 0 && q > Collation::NO_CE_WEIGHT16) {
                ++commonQuaternaries;
            } else if(q == Collation::NO_CE_WEIGHT16 &&
                    (options & CollationSettings::ALTERNATE_MASK) == 0 &&
                    quaternaries.isEmpty()) {
                // If alternate=non-ignorable and there are only common quaternary weights,
                // then we need not write anything.
                // The only weights greater than the merge separator and less than the common weight
                // are shifted primary weights, which are not generated for alternate=non-ignorable.
                // There are also exactly as many quaternary weights as tertiary weights,
                // so level length differences are handled already on tertiary level.
                // Any above-common quaternary weight will compare greater regardless.
                quaternaries.appendByte(Collation::LEVEL_SEPARATOR_BYTE);
            } else {
                if(q == Collation::NO_CE_WEIGHT16) {
                    q = Collation::LEVEL_SEPARATOR_BYTE;
                } else {
                    q = 0xfc + ((q >> 6) & 3);
                }
                if(commonQuaternaries != 0) {
                    --commonQuaternaries;
                    while(commonQuaternaries >= QUAT_COMMON_MAX_COUNT) {
                        quaternaries.appendByte(QUAT_COMMON_MIDDLE);
                        commonQuaternaries -= QUAT_COMMON_MAX_COUNT;
                    }
                    uint32_t b;
                    if(q < QUAT_COMMON_LOW) {
                        b = QUAT_COMMON_LOW + commonQuaternaries;
                    } else {
                        b = QUAT_COMMON_HIGH - commonQuaternaries;
                    }
                    quaternaries.appendByte(b);
                    commonQuaternaries = 0;
                }
                quaternaries.appendByte(q);
            }
        }

        if((lower32 >> 24) == Collation::LEVEL_SEPARATOR_BYTE) { break; }  // ce == NO_CE
    }

    if(U_FAILURE(errorCode)) { return; }

    // Append the beyond-primary levels.
    UBool ok = TRUE;
    if((levels & Collation::SECONDARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::SECONDARY_LEVEL)) { return; }
        ok &= secondaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        secondaries.appendTo(sink);
    }

    if((levels & Collation::CASE_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::CASE_LEVEL)) { return; }
        ok &= cases.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        // Write pairs of nibbles as bytes, except separator bytes as themselves.
        int32_t length = cases.length() - 1;  // Ignore the trailing NO_CE.
        uint8_t b = 0;
        for(int32_t i = 0; i < length; ++i) {
            uint8_t c = (uint8_t)cases[i];
            U_ASSERT((c & 0xf) == 0 && c != 0);
            if(b == 0) {
                b = c;
            } else {
                sink.Append(b | (c >> 4));
                b = 0;
            }
        }
        if(b != 0) {
            sink.Append(b);
        }
    }

    if((levels & Collation::TERTIARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::TERTIARY_LEVEL)) { return; }
        ok &= tertiaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        tertiaries.appendTo(sink);
    }

    if((levels & Collation::QUATERNARY_LEVEL_FLAG) != 0) {
        if(!callback.needToWrite(Collation::QUATERNARY_LEVEL)) { return; }
        ok &= quaternaries.isOk();
        sink.Append(Collation::LEVEL_SEPARATOR_BYTE);
        quaternaries.appendTo(sink);
    }

    if(!ok || !sink.IsOk()) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
}